

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecdsa_sign_verify(void)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  int recid;
  int getrec;
  secp256k1_scalar sigs;
  secp256k1_scalar sigr;
  secp256k1_scalar key;
  secp256k1_scalar msg;
  secp256k1_scalar one;
  secp256k1_ge pub;
  secp256k1_gej pubj;
  uint in_stack_fffffffffffffe7c;
  uint v;
  int in_stack_fffffffffffffe80;
  secp256k1_scalar *in_stack_fffffffffffffea0;
  secp256k1_scalar *in_stack_fffffffffffffea8;
  secp256k1_scalar *in_stack_fffffffffffffeb0;
  secp256k1_scalar *in_stack_fffffffffffffeb8;
  secp256k1_scalar *in_stack_fffffffffffffec0;
  secp256k1_gej *in_stack_fffffffffffffec8;
  secp256k1_ge *in_stack_fffffffffffffed0;
  secp256k1_scalar *in_stack_ffffffffffffffb0;
  secp256k1_gej *in_stack_ffffffffffffffb8;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffffc0;
  
  testutil_random_scalar_order_test(in_stack_fffffffffffffea0);
  testutil_random_scalar_order_test(in_stack_fffffffffffffea0);
  secp256k1_ecmult_gen
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  secp256k1_ge_set_gej(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  uVar3 = testrand_bits(in_stack_fffffffffffffe7c);
  iVar2 = (int)uVar3;
  if (iVar2 == 0) {
    random_sign(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                in_stack_fffffffffffffea8,(int *)in_stack_fffffffffffffea0);
    v = in_stack_fffffffffffffe7c;
  }
  else {
    random_sign(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                in_stack_fffffffffffffea8,(int *)in_stack_fffffffffffffea0);
    v = in_stack_fffffffffffffe7c & 0xffffff;
    if (-1 < in_stack_fffffffffffffe80) {
      v = CONCAT13(in_stack_fffffffffffffe80 < 4,(int3)in_stack_fffffffffffffe7c);
    }
    if ((((byte)(v >> 0x18) ^ 0xff) & 1) != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1899,"test condition failed: recid >= 0 && recid < 4");
      abort();
    }
  }
  iVar1 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)sigr.d[1],(secp256k1_scalar *)sigr.d[0],
                     (secp256k1_ge *)sigs.d[3],(secp256k1_scalar *)sigs.d[2]);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x189d,"test condition failed: secp256k1_ecdsa_sig_verify(&sigr, &sigs, &pub, &msg)");
    abort();
  }
  secp256k1_scalar_set_int((secp256k1_scalar *)CONCAT44(iVar2,in_stack_fffffffffffffe80),v);
  secp256k1_scalar_add
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  iVar2 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)sigr.d[1],(secp256k1_scalar *)sigr.d[0],
                     (secp256k1_ge *)sigs.d[3],(secp256k1_scalar *)sigs.d[2]);
  if (iVar2 == 0) {
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x18a0,"test condition failed: !secp256k1_ecdsa_sig_verify(&sigr, &sigs, &pub, &msg)");
  abort();
}

Assistant:

static void test_ecdsa_sign_verify(void) {
    secp256k1_gej pubj;
    secp256k1_ge pub;
    secp256k1_scalar one;
    secp256k1_scalar msg, key;
    secp256k1_scalar sigr, sigs;
    int getrec;
    int recid;
    testutil_random_scalar_order_test(&msg);
    testutil_random_scalar_order_test(&key);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &pubj, &key);
    secp256k1_ge_set_gej(&pub, &pubj);
    getrec = testrand_bits(1);
    /* The specific way in which this conditional is written sidesteps a potential bug in clang.
       See the commit messages of the commit that introduced this comment for details. */
    if (getrec) {
        random_sign(&sigr, &sigs, &key, &msg, &recid);
        CHECK(recid >= 0 && recid < 4);
    } else {
        random_sign(&sigr, &sigs, &key, &msg, NULL);
    }
    CHECK(secp256k1_ecdsa_sig_verify(&sigr, &sigs, &pub, &msg));
    secp256k1_scalar_set_int(&one, 1);
    secp256k1_scalar_add(&msg, &msg, &one);
    CHECK(!secp256k1_ecdsa_sig_verify(&sigr, &sigs, &pub, &msg));
}